

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemclr.c
# Opt level: O0

void smemclr(void *b,size_t n)

{
  size_t n_local;
  void *b_local;
  
  if ((b != (void *)0x0) && (n != 0)) {
    memset(b,0,n);
    no_op(b,n);
  }
  return;
}

Assistant:

void smemclr(void *b, size_t n)
{
    if (b && n > 0) {
        /*
         * Zero out the memory.
         */
        memset(b, 0, n);

        /*
         * Call the above function pointer, which (for all the
         * compiler knows) might check that we've really zeroed the
         * memory.
         */
        maybe_read(b, n);
    }
}